

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateDirectory.cxx
# Opt level: O0

cmValue __thiscall cmStateDirectory::GetProperty(cmStateDirectory *this,string *prop,bool chain)

{
  PositionType *this_00;
  pointer *__return_storage_ptr__;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  bool bVar1;
  __type _Var2;
  int iVar3;
  vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *this_01;
  size_type __n;
  string *psVar4;
  PointerType pBVar5;
  basic_string_view<char,_std::char_traits<char>_> __y;
  cmStateDirectory local_3b8;
  undefined1 local_390 [8];
  cmStateSnapshot parentSnapshot;
  cmValue retVal;
  string local_360;
  cmBTStringRange local_340;
  string local_330;
  cmBTStringRange local_310;
  string local_300;
  cmBTStringRange local_2e0;
  string local_2d0;
  cmBTStringRange local_2b0;
  string local_2a0;
  string local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_260;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_258;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_250;
  undefined1 local_238 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  res;
  string local_208;
  string local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1c8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1c0;
  cmStateSnapshot local_1b8;
  undefined1 local_1a0 [8];
  cmStateSnapshot snp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  listFiles;
  string local_120;
  string local_100;
  cmStateDirectory local_e0;
  reference local_b8;
  cmStateSnapshot *ci;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *__range2;
  vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *children;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  child_dirs;
  undefined1 local_40 [8];
  cmStateSnapshot parent;
  bool chain_local;
  string *prop_local;
  cmStateDirectory *this_local;
  
  parent.Position.Position._7_1_ = chain;
  if (GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_ == '\0') {
    iVar3 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_);
    if (iVar3 != 0) {
      std::__cxx11::string::string
                ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_);
      __cxa_atexit(std::__cxx11::string::~string,
                   &GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_);
    }
  }
  std::__cxx11::string::clear();
  bVar1 = std::operator==(prop,"PARENT_DIRECTORY");
  if (bVar1) {
    cmStateSnapshot::GetBuildsystemDirectoryParent((cmStateSnapshot *)local_40,&this->Snapshot_);
    bVar1 = cmStateSnapshot::IsValid((cmStateSnapshot *)local_40);
    if (bVar1) {
      cmStateSnapshot::GetDirectory
                ((cmStateDirectory *)
                 &child_dirs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(cmStateSnapshot *)local_40);
      psVar4 = GetCurrentSource_abi_cxx11_
                         ((cmStateDirectory *)
                          &child_dirs.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      cmValue::cmValue((cmValue *)&this_local,psVar4);
    }
    else {
      cmValue::cmValue((cmValue *)&this_local,
                       &GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_);
    }
  }
  else {
    _Var2 = std::operator==(prop,&kBINARY_DIR_abi_cxx11_);
    if (_Var2) {
      psVar4 = GetCurrentBinary_abi_cxx11_(this);
      std::__cxx11::string::operator=
                ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                 (string *)psVar4);
      cmValue::cmValue((cmValue *)&this_local,
                       &GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_);
    }
    else {
      _Var2 = std::operator==(prop,&kSOURCE_DIR_abi_cxx11_);
      if (_Var2) {
        psVar4 = GetCurrentSource_abi_cxx11_(this);
        std::__cxx11::string::operator=
                  ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                   (string *)psVar4);
        cmValue::cmValue((cmValue *)&this_local,
                         &GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_);
      }
      else {
        _Var2 = std::operator==(prop,&kSUBDIRECTORIES_abi_cxx11_);
        if (_Var2) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&children);
          pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                             (&this->DirectoryState);
          this_01 = &pBVar5->Children;
          __n = std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::size(this_01);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&children,__n);
          __end2 = std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::begin(this_01);
          ci = (cmStateSnapshot *)
               std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::end(this_01);
          while( true ) {
            bVar1 = __gnu_cxx::operator!=
                              (&__end2,(__normal_iterator<const_cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
                                        *)&ci);
            if (!bVar1) break;
            local_b8 = __gnu_cxx::
                       __normal_iterator<const_cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
                       ::operator*(&__end2);
            cmStateSnapshot::GetDirectory(&local_e0,local_b8);
            psVar4 = GetCurrentSource_abi_cxx11_(&local_e0);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&children,psVar4);
            __gnu_cxx::
            __normal_iterator<const_cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
            ::operator++(&__end2);
          }
          cmList::
          to_string<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                    (&local_100,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&children);
          std::__cxx11::string::operator=
                    ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                     (string *)&local_100);
          std::__cxx11::string::~string((string *)&local_100);
          cmValue::cmValue((cmValue *)&this_local,
                           &GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&children);
        }
        else {
          _Var2 = std::operator==(prop,&kBUILDSYSTEM_TARGETS_abi_cxx11_);
          if (_Var2) {
            pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::
                     operator->(&this->DirectoryState);
            cmList::
            to_string<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                      (&local_120,&pBVar5->NormalTargetNames);
            std::__cxx11::string::operator=
                      ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                       (string *)&local_120);
            std::__cxx11::string::~string((string *)&local_120);
            cmValue::cmValue((cmValue *)&this_local,
                             &GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_);
          }
          else {
            __x = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)prop);
            __y = (basic_string_view<char,_std::char_traits<char>_>)
                  ::cm::operator____s("IMPORTED_TARGETS",0x10);
            bVar1 = std::operator==(__x,__y);
            if (bVar1) {
              pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::
                       operator->(&this->DirectoryState);
              cmList::
              to_string<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                        ((string *)
                         &listFiles.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         &pBVar5->ImportedTargetNames);
              std::__cxx11::string::operator=
                        ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_
                         ,(string *)
                          &listFiles.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
              std::__cxx11::string::~string
                        ((string *)
                         &listFiles.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              cmValue::cmValue((cmValue *)&this_local,
                               &GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_);
            }
            else {
              bVar1 = std::operator==(prop,"LISTFILE_STACK");
              if (bVar1) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&snp.Position.Position);
                local_1a0 = (undefined1  [8])(this->Snapshot_).State;
                snp.State = (cmState *)(this->Snapshot_).Position.Tree;
                snp.Position.Tree =
                     (cmLinkedTree<cmStateDetail::SnapshotDataType> *)
                     (this->Snapshot_).Position.Position;
                while( true ) {
                  bVar1 = cmStateSnapshot::IsValid((cmStateSnapshot *)local_1a0);
                  if (!bVar1) break;
                  psVar4 = cmStateSnapshot::GetExecutionListFile_abi_cxx11_
                                     ((cmStateSnapshot *)local_1a0);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&snp.Position.Position,psVar4);
                  cmStateSnapshot::GetCallStackParent(&local_1b8,(cmStateSnapshot *)local_1a0);
                  local_1a0 = (undefined1  [8])local_1b8.State;
                  snp.State = (cmState *)local_1b8.Position.Tree;
                  snp.Position.Tree =
                       (cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_1b8.Position.Position;
                }
                this_00 = &snp.Position.Position;
                local_1c0._M_current =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)this_00);
                local_1c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)this_00);
                std::
                reverse<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                          (local_1c0,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )local_1c8);
                cmList::
                to_string<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                          (&local_1e8,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&snp.Position.Position);
                std::__cxx11::string::operator=
                          ((string *)
                           &GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                           (string *)&local_1e8);
                std::__cxx11::string::~string((string *)&local_1e8);
                cmValue::cmValue((cmValue *)&this_local,
                                 &GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&snp.Position.Position);
              }
              else {
                bVar1 = std::operator==(prop,"CACHE_VARIABLES");
                if (bVar1) {
                  __return_storage_ptr__ =
                       &res.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  cmState::GetCacheEntryKeys_abi_cxx11_
                            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)__return_storage_ptr__,(this->Snapshot_).State);
                  cmList::
                  to_string<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                            (&local_208,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)__return_storage_ptr__);
                  std::__cxx11::string::operator=
                            ((string *)
                             &GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                             (string *)&local_208);
                  std::__cxx11::string::~string((string *)&local_208);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&res.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  cmValue::cmValue((cmValue *)&this_local,
                                   &GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_
                                  );
                }
                else {
                  bVar1 = std::operator==(prop,"VARIABLES");
                  if (bVar1) {
                    cmStateSnapshot::ClosureKeys_abi_cxx11_
                              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_238,&this->Snapshot_);
                    cmState::GetCacheEntryKeys_abi_cxx11_(&local_250,(this->Snapshot_).State);
                    ::cm::
                    append<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_238,&local_250);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector(&local_250);
                    local_258._M_current =
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_238);
                    local_260 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )std::
                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)local_238);
                    std::
                    sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                              (local_258,
                               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                )local_260);
                    cmList::
                    to_string<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                              (&local_280,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_238);
                    std::__cxx11::string::operator=
                              ((string *)
                               &GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                               (string *)&local_280);
                    std::__cxx11::string::~string((string *)&local_280);
                    cmValue::cmValue((cmValue *)&this_local,
                                     &GetProperty(std::__cxx11::string_const&,bool)::
                                      output_abi_cxx11_);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_238);
                  }
                  else {
                    bVar1 = std::operator==(prop,"INCLUDE_DIRECTORIES");
                    if (bVar1) {
                      local_2b0 = GetIncludeDirectoriesEntries_abi_cxx11_(this);
                      cmList::
                      to_string<cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_0>
                                (&local_2a0,&local_2b0);
                      std::__cxx11::string::operator=
                                ((string *)
                                 &GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                                 (string *)&local_2a0);
                      std::__cxx11::string::~string((string *)&local_2a0);
                      cmValue::cmValue((cmValue *)&this_local,
                                       &GetProperty(std::__cxx11::string_const&,bool)::
                                        output_abi_cxx11_);
                    }
                    else {
                      bVar1 = std::operator==(prop,"COMPILE_OPTIONS");
                      if (bVar1) {
                        local_2e0 = GetCompileOptionsEntries_abi_cxx11_(this);
                        cmList::
                        to_string<cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_0>
                                  (&local_2d0,&local_2e0);
                        std::__cxx11::string::operator=
                                  ((string *)
                                   &GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_
                                   ,(string *)&local_2d0);
                        std::__cxx11::string::~string((string *)&local_2d0);
                        cmValue::cmValue((cmValue *)&this_local,
                                         &GetProperty(std::__cxx11::string_const&,bool)::
                                          output_abi_cxx11_);
                      }
                      else {
                        bVar1 = std::operator==(prop,"COMPILE_DEFINITIONS");
                        if (bVar1) {
                          local_310 = GetCompileDefinitionsEntries_abi_cxx11_(this);
                          cmList::
                          to_string<cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_0>
                                    (&local_300,&local_310);
                          std::__cxx11::string::operator=
                                    ((string *)
                                     &GetProperty(std::__cxx11::string_const&,bool)::
                                      output_abi_cxx11_,(string *)&local_300);
                          std::__cxx11::string::~string((string *)&local_300);
                          cmValue::cmValue((cmValue *)&this_local,
                                           &GetProperty(std::__cxx11::string_const&,bool)::
                                            output_abi_cxx11_);
                        }
                        else {
                          bVar1 = std::operator==(prop,"LINK_OPTIONS");
                          if (bVar1) {
                            local_340 = GetLinkOptionsEntries_abi_cxx11_(this);
                            cmList::
                            to_string<cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_0>
                                      (&local_330,&local_340);
                            std::__cxx11::string::operator=
                                      ((string *)
                                       &GetProperty(std::__cxx11::string_const&,bool)::
                                        output_abi_cxx11_,(string *)&local_330);
                            std::__cxx11::string::~string((string *)&local_330);
                            cmValue::cmValue((cmValue *)&this_local,
                                             &GetProperty(std::__cxx11::string_const&,bool)::
                                              output_abi_cxx11_);
                          }
                          else {
                            bVar1 = std::operator==(prop,"LINK_DIRECTORIES");
                            if (bVar1) {
                              _retVal = GetLinkDirectoriesEntries_abi_cxx11_(this);
                              cmList::
                              to_string<cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_0>
                                        (&local_360,
                                         (cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                          *)&retVal);
                              std::__cxx11::string::operator=
                                        ((string *)
                                         &GetProperty(std::__cxx11::string_const&,bool)::
                                          output_abi_cxx11_,(string *)&local_360);
                              std::__cxx11::string::~string((string *)&local_360);
                              cmValue::cmValue((cmValue *)&this_local,
                                               &GetProperty(std::__cxx11::string_const&,bool)::
                                                output_abi_cxx11_);
                            }
                            else {
                              pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::
                                       iterator::operator->(&this->DirectoryState);
                              parentSnapshot.Position.Position =
                                   (PositionType)
                                   cmPropertyMap::GetPropertyValue(&pBVar5->Properties,prop);
                              bVar1 = cmValue::operator_cast_to_bool
                                                ((cmValue *)&parentSnapshot.Position.Position);
                              if ((bVar1) || ((parent.Position.Position._7_1_ & 1) == 0)) {
                                this_local = (cmStateDirectory *)parentSnapshot.Position.Position;
                              }
                              else {
                                cmStateSnapshot::GetBuildsystemDirectoryParent
                                          ((cmStateSnapshot *)local_390,&this->Snapshot_);
                                bVar1 = cmStateSnapshot::IsValid((cmStateSnapshot *)local_390);
                                if (bVar1) {
                                  cmStateSnapshot::GetDirectory
                                            (&local_3b8,(cmStateSnapshot *)local_390);
                                  this_local = (cmStateDirectory *)
                                               GetProperty(&local_3b8,prop,
                                                           (bool)(parent.Position.Position._7_1_ & 1
                                                                 ));
                                }
                                else {
                                  this_local = (cmStateDirectory *)
                                               cmState::GetGlobalProperty
                                                         ((this->Snapshot_).State,prop);
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return (cmValue)(string *)this_local;
}

Assistant:

cmValue cmStateDirectory::GetProperty(const std::string& prop,
                                      bool chain) const
{
  static std::string output;
  output.clear();
  if (prop == "PARENT_DIRECTORY") {
    cmStateSnapshot parent = this->Snapshot_.GetBuildsystemDirectoryParent();
    if (parent.IsValid()) {
      return cmValue(parent.GetDirectory().GetCurrentSource());
    }
    return cmValue(output);
  }
  if (prop == kBINARY_DIR) {
    output = this->GetCurrentBinary();
    return cmValue(output);
  }
  if (prop == kSOURCE_DIR) {
    output = this->GetCurrentSource();
    return cmValue(output);
  }
  if (prop == kSUBDIRECTORIES) {
    std::vector<std::string> child_dirs;
    std::vector<cmStateSnapshot> const& children =
      this->DirectoryState->Children;
    child_dirs.reserve(children.size());
    for (cmStateSnapshot const& ci : children) {
      child_dirs.push_back(ci.GetDirectory().GetCurrentSource());
    }
    output = cmList::to_string(child_dirs);
    return cmValue(output);
  }
  if (prop == kBUILDSYSTEM_TARGETS) {
    output = cmList::to_string(this->DirectoryState->NormalTargetNames);
    return cmValue(output);
  }
  if (prop == "IMPORTED_TARGETS"_s) {
    output = cmList::to_string(this->DirectoryState->ImportedTargetNames);
    return cmValue(output);
  }

  if (prop == "LISTFILE_STACK") {
    std::vector<std::string> listFiles;
    cmStateSnapshot snp = this->Snapshot_;
    while (snp.IsValid()) {
      listFiles.push_back(snp.GetExecutionListFile());
      snp = snp.GetCallStackParent();
    }
    std::reverse(listFiles.begin(), listFiles.end());
    output = cmList::to_string(listFiles);
    return cmValue(output);
  }
  if (prop == "CACHE_VARIABLES") {
    output = cmList::to_string(this->Snapshot_.State->GetCacheEntryKeys());
    return cmValue(output);
  }
  if (prop == "VARIABLES") {
    std::vector<std::string> res = this->Snapshot_.ClosureKeys();
    cm::append(res, this->Snapshot_.State->GetCacheEntryKeys());
    std::sort(res.begin(), res.end());
    output = cmList::to_string(res);
    return cmValue(output);
  }
  if (prop == "INCLUDE_DIRECTORIES") {
    output = cmList::to_string(this->GetIncludeDirectoriesEntries());
    return cmValue(output);
  }
  if (prop == "COMPILE_OPTIONS") {
    output = cmList::to_string(this->GetCompileOptionsEntries());
    return cmValue(output);
  }
  if (prop == "COMPILE_DEFINITIONS") {
    output = cmList::to_string(this->GetCompileDefinitionsEntries());
    return cmValue(output);
  }
  if (prop == "LINK_OPTIONS") {
    output = cmList::to_string(this->GetLinkOptionsEntries());
    return cmValue(output);
  }
  if (prop == "LINK_DIRECTORIES") {
    output = cmList::to_string(this->GetLinkDirectoriesEntries());
    return cmValue(output);
  }

  cmValue retVal = this->DirectoryState->Properties.GetPropertyValue(prop);
  if (!retVal && chain) {
    cmStateSnapshot parentSnapshot =
      this->Snapshot_.GetBuildsystemDirectoryParent();
    if (parentSnapshot.IsValid()) {
      return parentSnapshot.GetDirectory().GetProperty(prop, chain);
    }
    return this->Snapshot_.State->GetGlobalProperty(prop);
  }

  return retVal;
}